

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeComponentGraph.cxx
# Opt level: O1

void __thiscall cmComputeComponentGraph::TransferEdges(cmComputeComponentGraph *this)

{
  pointer pcVar1;
  pointer pcVar2;
  unsigned_long uVar3;
  long lVar4;
  cmGraphEdge *ni;
  pointer pcVar5;
  size_t j_component;
  bool local_42;
  bool local_41;
  long local_40;
  unsigned_long local_38;
  
  lVar4 = (long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    local_40 = (lVar4 >> 3) * -0x5555555555555555;
    local_40 = local_40 + (ulong)(local_40 == 0);
    lVar4 = 0;
    do {
      pcVar1 = (this->InputGraph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5 = *(pointer *)&pcVar1[lVar4].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      pcVar2 = *(pointer *)((long)(pcVar1 + lVar4) + 8);
      if (pcVar5 != pcVar2) {
        uVar3 = (this->TarjanComponents).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
        do {
          local_38 = (this->TarjanComponents).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[pcVar5->Dest];
          if (uVar3 != local_38) {
            local_41 = pcVar5->Strong;
            local_42 = pcVar5->Cross;
            std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
            emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                      ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                       ((this->ComponentGraph).
                        super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                        _M_impl.super__Vector_impl_data._M_start + uVar3),&local_38,&local_41,
                       &local_42,&pcVar5->Backtrace);
          }
          pcVar5 = pcVar5 + 1;
        } while (pcVar5 != pcVar2);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != local_40);
  }
  return;
}

Assistant:

void cmComputeComponentGraph::TransferEdges()
{
  // Map inter-component edges in the original graph to edges in the
  // component graph.
  size_t n = this->InputGraph.size();
  for (size_t i = 0; i < n; ++i) {
    size_t i_component = this->TarjanComponents[i];
    EdgeList const& nl = this->InputGraph[i];
    for (cmGraphEdge const& ni : nl) {
      size_t j = ni;
      size_t j_component = this->TarjanComponents[j];
      if (i_component != j_component) {
        // We do not attempt to combine duplicate edges, but instead
        // store the inter-component edges with suitable multiplicity.
        this->ComponentGraph[i_component].emplace_back(
          j_component, ni.IsStrong(), ni.IsCross(), ni.GetBacktrace());
      }
    }
  }
}